

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Thread.cpp
# Opt level: O2

bool __thiscall axl::sys::psx::Thread::join(Thread *this,void **retVal)

{
  uint_t code;
  bool bVar1;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  bVar1 = true;
  if (this->m_isOpen == true) {
    code = pthread_join(this->m_threadId,retVal);
    if (code == 0) {
      this->m_isOpen = false;
    }
    else {
      err::ErrorRef::ErrorRef((ErrorRef *)&BStack_28,code);
      err::setError((ErrorRef *)&BStack_28);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&BStack_28);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool
Thread::join(void** retVal) {
	if (!m_isOpen)
		return true;

	int result = ::pthread_join(m_threadId, retVal);
	if (result != 0)
		return err::fail(result);

	m_isOpen = false;
	return true;
}